

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivySeq.c
# Opt level: O0

void Ivy_CutComputeAll(Ivy_Man_t *p,int nInputs)

{
  int iVar1;
  int iVar2;
  abctime aVar3;
  Ivy_Obj_t *pObj_00;
  Ivy_Store_t *pIVar4;
  abctime aVar5;
  abctime clk;
  uint local_38;
  int nNodeOver;
  int nNodeTotal;
  int nCutsTotalM;
  int nCutsTotal;
  int i;
  Ivy_Obj_t *pObj;
  Ivy_Store_t *pStore;
  int nInputs_local;
  Ivy_Man_t *p_local;
  
  aVar3 = Abc_Clock();
  if (nInputs < 7) {
    clk._4_4_ = 0;
    local_38 = 0;
    iVar1 = Ivy_ManNodeNum(p);
    nNodeOver = -iVar1;
    nNodeTotal = nNodeOver;
    for (nCutsTotalM = 0; iVar1 = Vec_PtrSize(p->vObjs), nCutsTotalM < iVar1;
        nCutsTotalM = nCutsTotalM + 1) {
      pObj_00 = (Ivy_Obj_t *)Vec_PtrEntry(p->vObjs,nCutsTotalM);
      if ((pObj_00 != (Ivy_Obj_t *)0x0) && (iVar1 = Ivy_ObjIsNode(pObj_00), iVar1 != 0)) {
        pIVar4 = Ivy_CutComputeForNode(p,pObj_00,nInputs);
        nNodeTotal = pIVar4->nCuts + nNodeTotal;
        nNodeOver = pIVar4->nCutsM + nNodeOver;
        clk._4_4_ = pIVar4->fSatur + clk._4_4_;
        local_38 = local_38 + 1;
      }
    }
    iVar1 = Ivy_ManPiNum(p);
    iVar2 = Ivy_ManNodeNum(p);
    printf("All = %6d. Minus = %6d. Triv = %6d.   Node = %6d. Satur = %6d.  ",
           (ulong)(uint)nNodeTotal,(ulong)(uint)nNodeOver,(ulong)(uint)(iVar1 + iVar2),
           (ulong)local_38,(ulong)clk._4_4_);
    Abc_Print(1,"%s =","Time");
    aVar5 = Abc_Clock();
    Abc_Print(1,"%9.2f sec\n",((double)(aVar5 - aVar3) * 1.0) / 1000000.0);
  }
  else {
    printf("Cannot compute cuts for more than %d inputs.\n",6);
  }
  return;
}

Assistant:

void Ivy_CutComputeAll( Ivy_Man_t * p, int nInputs )
{
    Ivy_Store_t * pStore;
    Ivy_Obj_t * pObj;
    int i, nCutsTotal, nCutsTotalM, nNodeTotal, nNodeOver;
    abctime clk = Abc_Clock();
    if ( nInputs > IVY_CUT_INPUT )
    {
        printf( "Cannot compute cuts for more than %d inputs.\n", IVY_CUT_INPUT );
        return;
    }
    nNodeTotal = nNodeOver = 0;
    nCutsTotal = nCutsTotalM = -Ivy_ManNodeNum(p);
    Ivy_ManForEachObj( p, pObj, i )
    {
        if ( !Ivy_ObjIsNode(pObj) )
            continue;
        pStore = Ivy_CutComputeForNode( p, pObj, nInputs );
        nCutsTotal  += pStore->nCuts;
        nCutsTotalM += pStore->nCutsM;
        nNodeOver   += pStore->fSatur;
        nNodeTotal++;
    }
    printf( "All = %6d. Minus = %6d. Triv = %6d.   Node = %6d. Satur = %6d.  ", 
        nCutsTotal, nCutsTotalM, Ivy_ManPiNum(p) + Ivy_ManNodeNum(p), nNodeTotal, nNodeOver );
    ABC_PRT( "Time", Abc_Clock() - clk );
}